

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  size_t i;
  size_t sVar3;
  FindInfo FVar4;
  Layout LVar5;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8dd,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<char>, phmap::Hash<char>, phmap::EqualTo<char>, std::allocator<char>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<char>, Hash = phmap::Hash<char>, Eq = phmap::EqualTo<char>, Alloc = std::allocator<char>]"
                 );
  }
  p = this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  initialize_slots(this,new_capacity);
  this->capacity_ = new_capacity;
  for (sVar3 = 0; capacity != sVar3; sVar3 = sVar3 + 1) {
    if (-1 < p[sVar3]) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)psVar1[sVar3];
      hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar4 = find_first_non_full(this,hashval);
      set_ctrl(this,FVar4.offset,(byte)hashval & 0x7f);
      this->slots_[FVar4.offset] = psVar1[sVar3];
    }
  }
  if (capacity != 0) {
    LVar5 = MakeLayout(capacity);
    Deallocate<1ul,std::allocator<char>>
              ((allocator<char> *)&this->settings_,p,
               LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_char>.size_[1] +
               LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_char>.size_[0]);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n)
		{
			return ((n + 1) & n) == 0 && n > 0;
		}